

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexParser.cpp
# Opt level: O0

bool __thiscall
UnifiedRegex::Parser<UTF8EncodingPolicyBase<false>,_true>::AtomEscapePass1
          (Parser<UTF8EncodingPolicyBase<false>,_true> *this,Node **node,
          MatchCharNode *deferredCharNode,bool *previousSurrogatePart)

{
  StandardChars<unsigned_char> *pSVar1;
  code *pcVar2;
  bool bVar3;
  EncodedChar EVar4;
  char16 cVar5;
  Char CVar6;
  uint uVar7;
  int iVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *pAVar13;
  MatchGroupNode *this_00;
  undefined4 *puVar14;
  WordBoundaryNode *pWVar15;
  MatchSetNode *pMVar16;
  Node *pNVar17;
  CharCount n_00;
  bool local_221;
  bool local_1d1;
  TrackAllocData local_1a0;
  MatchSetNode *local_178;
  MatchSetNode *setNode_2;
  undefined8 local_168;
  TrackAllocData local_160;
  MatchSetNode *local_138;
  MatchSetNode *setNode_1;
  undefined8 local_128;
  TrackAllocData local_120;
  MatchSetNode *local_f8;
  MatchSetNode *setNode;
  undefined8 local_e8;
  TrackAllocData local_e0;
  code *local_b8;
  undefined8 local_b0;
  TrackAllocData local_a8;
  Char local_80;
  Char local_7e;
  uint local_7c;
  Char c_1;
  Char c;
  uint m;
  CharCount digits;
  uint n;
  undefined8 local_68;
  TrackAllocData local_60;
  CharCount local_38;
  int local_34;
  CharCount digits_1;
  int n_1;
  bool *previousSurrogatePart_local;
  MatchCharNode *deferredCharNode_local;
  Node **node_local;
  Parser<UTF8EncodingPolicyBase<false>,_true> *this_local;
  
  _digits_1 = previousSurrogatePart;
  previousSurrogatePart_local = (bool *)deferredCharNode;
  deferredCharNode_local = (MatchCharNode *)node;
  node_local = (Node **)this;
  bVar3 = IsEOF(this);
  if (bVar3) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar14 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar14 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                       ,0x643,"(!IsEOF())","!IsEOF()");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar14 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar14 = 0;
  }
  pSVar1 = this->standardEncodedChars;
  EVar4 = ECLookahead(this,0);
  bVar3 = StandardChars<unsigned_char>::IsDigit(pSVar1,EVar4);
  if (!bVar3) {
    EVar4 = ECLookahead(this,0);
    if (EVar4 != 'c') {
      local_80 = NextChar(this);
      switch(local_80) {
      case L'$':
      case L'(':
      case L')':
      case L'*':
      case L'+':
      case L'.':
      case L'/':
      case L'?':
      case L'[':
      case L'\\':
      case L']':
      case L'^':
      case L'{':
      case L'|':
      case L'}':
        break;
      default:
        if ((this->unicodeFlagPresent & 1U) != 0) {
          Fail(this,-0x7ff5e9d6);
        }
        break;
      case L'B':
        pAVar13 = &this->ctAllocator->
                   super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>;
        Memory::TrackAllocData::CreateTrackAllocData
                  (&local_e0,(type_info *)&WordBoundaryNode::typeinfo,0,0xffffffffffffffff,
                   "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                   ,0x69d);
        pAVar13 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
                  TrackAllocInfo(pAVar13,&local_e0);
        setNode = (MatchSetNode *)Memory::ArenaAllocator::Alloc;
        local_e8 = 0;
        pWVar15 = (WordBoundaryNode *)
                  new<Memory::ArenaAllocator>(0x40,(ArenaAllocator *)pAVar13,0x3f67b0);
        WordBoundaryNode::WordBoundaryNode(pWVar15,true);
        (deferredCharNode_local->super_Node)._vptr_Node = (_func_int **)pWVar15;
        return true;
      case L'D':
        pNVar17 = GetNodeWithValidCharacterSet(this,'D');
        (deferredCharNode_local->super_Node)._vptr_Node = (_func_int **)pNVar17;
        return false;
      case L'S':
        pNVar17 = GetNodeWithValidCharacterSet(this,'S');
        (deferredCharNode_local->super_Node)._vptr_Node = (_func_int **)pNVar17;
        return false;
      case L'W':
        pNVar17 = GetNodeWithValidCharacterSet(this,'W');
        (deferredCharNode_local->super_Node)._vptr_Node = (_func_int **)pNVar17;
        return false;
      case L'b':
        pAVar13 = &this->ctAllocator->
                   super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>;
        Memory::TrackAllocData::CreateTrackAllocData
                  (&local_a8,(type_info *)&WordBoundaryNode::typeinfo,0,0xffffffffffffffff,
                   "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                   ,0x69a);
        pAVar13 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
                  TrackAllocInfo(pAVar13,&local_a8);
        local_b8 = Memory::ArenaAllocator::Alloc;
        local_b0 = 0;
        pWVar15 = (WordBoundaryNode *)
                  new<Memory::ArenaAllocator>(0x40,(ArenaAllocator *)pAVar13,0x3f67b0);
        WordBoundaryNode::WordBoundaryNode(pWVar15,false);
        (deferredCharNode_local->super_Node)._vptr_Node = (_func_int **)pWVar15;
        return true;
      case L'd':
        pAVar13 = &this->ctAllocator->
                   super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>;
        Memory::TrackAllocData::CreateTrackAllocData
                  (&local_120,(type_info *)&MatchSetNode::typeinfo,0,0xffffffffffffffff,
                   "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                   ,0x6b0);
        pAVar13 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
                  TrackAllocInfo(pAVar13,&local_120);
        setNode_1 = (MatchSetNode *)Memory::ArenaAllocator::Alloc;
        local_128 = 0;
        pMVar16 = (MatchSetNode *)
                  new<Memory::ArenaAllocator>(0x68,(ArenaAllocator *)pAVar13,0x3f67b0);
        MatchSetNode::MatchSetNode(pMVar16,false,false);
        local_f8 = pMVar16;
        StandardChars<char16_t>::SetDigits(this->standardChars,this->ctAllocator,&pMVar16->set);
        (deferredCharNode_local->super_Node)._vptr_Node = (_func_int **)local_f8;
        return false;
      case L'f':
        local_80 = L'\f';
        break;
      case L'n':
        local_80 = L'\n';
        break;
      case L'r':
        local_80 = L'\r';
        break;
      case L's':
        pAVar13 = &this->ctAllocator->
                   super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>;
        Memory::TrackAllocData::CreateTrackAllocData
                  (&local_160,(type_info *)&MatchSetNode::typeinfo,0,0xffffffffffffffff,
                   "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                   ,0x6bc);
        pAVar13 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
                  TrackAllocInfo(pAVar13,&local_160);
        setNode_2 = (MatchSetNode *)Memory::ArenaAllocator::Alloc;
        local_168 = 0;
        pMVar16 = (MatchSetNode *)
                  new<Memory::ArenaAllocator>(0x68,(ArenaAllocator *)pAVar13,0x3f67b0);
        MatchSetNode::MatchSetNode(pMVar16,false,false);
        local_138 = pMVar16;
        StandardChars<char16_t>::SetWhitespace(this->standardChars,this->ctAllocator,&pMVar16->set);
        (deferredCharNode_local->super_Node)._vptr_Node = (_func_int **)local_138;
        return false;
      case L't':
        local_80 = L'\t';
        break;
      case L'u':
        if ((((this->unicodeFlagPresent & 1U) == 0) ||
            (iVar8 = TryParseExtendedUnicodeEscape(this,&local_80,_digits_1,false), iVar8 < 1)) &&
           (bVar3 = ECCanConsume(this,4), bVar3)) {
          pSVar1 = this->standardEncodedChars;
          EVar4 = ECLookahead(this,0);
          bVar3 = StandardChars<unsigned_char>::IsHex(pSVar1,EVar4);
          if (bVar3) {
            pSVar1 = this->standardEncodedChars;
            EVar4 = ECLookahead(this,1);
            bVar3 = StandardChars<unsigned_char>::IsHex(pSVar1,EVar4);
            if (bVar3) {
              pSVar1 = this->standardEncodedChars;
              EVar4 = ECLookahead(this,2);
              bVar3 = StandardChars<unsigned_char>::IsHex(pSVar1,EVar4);
              if (bVar3) {
                pSVar1 = this->standardEncodedChars;
                EVar4 = ECLookahead(this,3);
                bVar3 = StandardChars<unsigned_char>::IsHex(pSVar1,EVar4);
                if (bVar3) {
                  pSVar1 = this->standardEncodedChars;
                  EVar4 = ECLookahead(this,0);
                  uVar9 = StandardChars<unsigned_char>::DigitValue(pSVar1,EVar4);
                  pSVar1 = this->standardEncodedChars;
                  EVar4 = ECLookahead(this,1);
                  uVar10 = StandardChars<unsigned_char>::DigitValue(pSVar1,EVar4);
                  pSVar1 = this->standardEncodedChars;
                  EVar4 = ECLookahead(this,2);
                  uVar11 = StandardChars<unsigned_char>::DigitValue(pSVar1,EVar4);
                  pSVar1 = this->standardEncodedChars;
                  EVar4 = ECLookahead(this,3);
                  uVar12 = StandardChars<unsigned_char>::DigitValue(pSVar1,EVar4);
                  local_80 = Chars<char16_t>::UTC(uVar9 << 0xc | uVar10 << 8 | uVar11 << 4 | uVar12)
                  ;
                  ECConsume(this,4);
                }
              }
            }
          }
        }
        break;
      case L'v':
        local_80 = L'\v';
        break;
      case L'w':
        pAVar13 = &this->ctAllocator->
                   super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>;
        Memory::TrackAllocData::CreateTrackAllocData
                  (&local_1a0,(type_info *)&MatchSetNode::typeinfo,0,0xffffffffffffffff,
                   "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                   ,0x6c8);
        pAVar13 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
                  TrackAllocInfo(pAVar13,&local_1a0);
        pMVar16 = (MatchSetNode *)
                  new<Memory::ArenaAllocator>(0x68,(ArenaAllocator *)pAVar13,0x3f67b0);
        MatchSetNode::MatchSetNode(pMVar16,false,false);
        local_178 = pMVar16;
        if (((this->unicodeFlagPresent & 1U) == 0) || ((this->caseInsensitiveFlagPresent & 1U) == 0)
           ) {
          StandardChars<char16_t>::SetWordChars(this->standardChars,this->ctAllocator,&pMVar16->set)
          ;
        }
        else {
          StandardChars<char16_t>::SetWordIUChars
                    (this->standardChars,this->ctAllocator,&pMVar16->set);
        }
        (deferredCharNode_local->super_Node)._vptr_Node = (_func_int **)local_178;
        return false;
      case L'x':
        bVar3 = ECCanConsume(this,2);
        if (bVar3) {
          pSVar1 = this->standardEncodedChars;
          EVar4 = ECLookahead(this,0);
          bVar3 = StandardChars<unsigned_char>::IsHex(pSVar1,EVar4);
          if (bVar3) {
            pSVar1 = this->standardEncodedChars;
            EVar4 = ECLookahead(this,1);
            bVar3 = StandardChars<unsigned_char>::IsHex(pSVar1,EVar4);
            if (bVar3) {
              pSVar1 = this->standardEncodedChars;
              EVar4 = ECLookahead(this,0);
              uVar9 = StandardChars<unsigned_char>::DigitValue(pSVar1,EVar4);
              pSVar1 = this->standardEncodedChars;
              EVar4 = ECLookahead(this,1);
              uVar10 = StandardChars<unsigned_char>::DigitValue(pSVar1,EVar4);
              local_80 = Chars<char16_t>::UTC(uVar9 << 4 | uVar10);
              ECConsume(this,2);
            }
          }
        }
      }
      *(Char *)(previousSurrogatePart_local + 0x38) = local_80;
      (deferredCharNode_local->super_Node)._vptr_Node = (_func_int **)previousSurrogatePart_local;
      return false;
    }
    pSVar1 = this->standardEncodedChars;
    EVar4 = ECLookahead(this,1);
    bVar3 = StandardChars<unsigned_char>::IsLetter(pSVar1,EVar4);
    if (bVar3) {
      EVar4 = ECLookahead(this,1);
      uVar9 = Chars<unsigned_char>::CTU(EVar4);
      local_7e = Chars<char16_t>::UTC(uVar9 & 0x1f);
      ECConsume(this,2);
    }
    else {
      local_7e = L'\\';
    }
    *(Char *)(previousSurrogatePart_local + 0x38) = local_7e;
    (deferredCharNode_local->super_Node)._vptr_Node = (_func_int **)previousSurrogatePart_local;
    return false;
  }
  EVar4 = ECLookahead(this,0);
  if (EVar4 != '0') {
    local_34 = 0;
    local_38 = 0;
    do {
      iVar8 = local_34 * 10;
      pSVar1 = this->standardEncodedChars;
      EVar4 = ECLookahead(this,local_38);
      uVar9 = StandardChars<unsigned_char>::DigitValue(pSVar1,EVar4);
      local_34 = iVar8 + uVar9;
      uVar7 = local_38 + 1;
      local_1d1 = false;
      if (uVar7 < 5) {
        n_00 = local_38 + 2;
        local_38 = uVar7;
        bVar3 = ECCanConsume(this,n_00);
        local_1d1 = false;
        uVar7 = local_38;
        if (bVar3) {
          pSVar1 = this->standardEncodedChars;
          EVar4 = ECLookahead(this,local_38);
          local_1d1 = StandardChars<unsigned_char>::IsDigit(pSVar1,EVar4);
          uVar7 = local_38;
        }
      }
      local_38 = uVar7;
    } while (local_1d1 != false);
    if (local_34 < (int)(uint)this->numGroups) {
      bVar3 = ECCanConsume(this,local_38 + 1);
      if (!bVar3) {
LAB_015b50ed:
        ECConsume(this,local_38);
        pAVar13 = &this->ctAllocator->
                   super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>;
        Memory::TrackAllocData::CreateTrackAllocData
                  (&local_60,(type_info *)&MatchGroupNode::typeinfo,0,0xffffffffffffffff,
                   "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                   ,0x66a);
        pAVar13 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
                  TrackAllocInfo(pAVar13,&local_60);
        _digits = Memory::ArenaAllocator::Alloc;
        local_68 = 0;
        this_00 = (MatchGroupNode *)
                  new<Memory::ArenaAllocator>(0x40,(ArenaAllocator *)pAVar13,0x3f67b0);
        MatchGroupNode::MatchGroupNode(this_00,local_34);
        (deferredCharNode_local->super_Node)._vptr_Node = (_func_int **)this_00;
        return false;
      }
      pSVar1 = this->standardEncodedChars;
      EVar4 = ECLookahead(this,local_38);
      bVar3 = StandardChars<unsigned_char>::IsDigit(pSVar1,EVar4);
      if (!bVar3) goto LAB_015b50ed;
    }
    pSVar1 = this->standardEncodedChars;
    EVar4 = ECLookahead(this,0);
    bVar3 = StandardChars<unsigned_char>::IsOctal(pSVar1,EVar4);
    if (!bVar3) {
      EVar4 = ECLookahead(this,0);
      cVar5 = Chars<unsigned_char>::CTW(EVar4);
      *(char16 *)(previousSurrogatePart_local + 0x38) = cVar5;
      ECConsume(this,1);
      (deferredCharNode_local->super_Node)._vptr_Node = (_func_int **)previousSurrogatePart_local;
      return false;
    }
  }
  pSVar1 = this->standardEncodedChars;
  EVar4 = ECLookahead(this,0);
  bVar3 = StandardChars<unsigned_char>::IsOctal(pSVar1,EVar4);
  if (!bVar3) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar14 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar14 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                       ,0x670,"(standardEncodedChars->IsOctal(ECLookahead()))",
                       "standardEncodedChars->IsOctal(ECLookahead())");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar14 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar14 = 0;
  }
  m = 0;
  _c_1 = 0;
  do {
    iVar8 = m * 8;
    pSVar1 = this->standardEncodedChars;
    EVar4 = ECLookahead(this,0);
    uVar9 = StandardChars<unsigned_char>::DigitValue(pSVar1,EVar4);
    local_7c = iVar8 + uVar9;
    if (0xff < local_7c) break;
    m = local_7c;
    ECConsume(this,1);
    _c_1 = _c_1 + 1;
    local_221 = false;
    if (_c_1 < 3) {
      pSVar1 = this->standardEncodedChars;
      EVar4 = ECLookahead(this,0);
      local_221 = StandardChars<unsigned_char>::IsOctal(pSVar1,EVar4);
    }
  } while (local_221 != false);
  CVar6 = Chars<char16_t>::UTC(m & 0xffff);
  *(Char *)(previousSurrogatePart_local + 0x38) = CVar6;
  (deferredCharNode_local->super_Node)._vptr_Node = (_func_int **)previousSurrogatePart_local;
  return false;
}

Assistant:

bool Parser<P, IsLiteral>::AtomEscapePass1(Node*& node, MatchCharNode* deferredCharNode, bool& previousSurrogatePart)
    {
        Assert(!IsEOF()); // checked for terminating 0 in pass 0
        if (standardEncodedChars->IsDigit(ECLookahead()))
        {
            // As per Annex B, allow octal escapes as well as group references, disambiguate based on known
            // number of groups.
            if (ECLookahead() == '0')
            {
                // fall through for octal
            }
            else
            {
                // Could be a group reference, but only if between 1 and 5 digits which resolve to a valid group number
                int n = 0;
                CharCount digits = 0;
                do
                {
                    n = n * 10 + (int)standardEncodedChars->DigitValue(ECLookahead(digits));
                    digits++;
                }
                while (digits < 5 && ECCanConsume(digits + 1) && standardEncodedChars->IsDigit(ECLookahead(digits)));
                if (n >= numGroups ||
                    (ECCanConsume(digits + 1) && standardEncodedChars->IsDigit(ECLookahead(digits))))
                {
                    if (standardEncodedChars->IsOctal(ECLookahead()))
                    {
                        // fall through for octal
                    }
                    else
                    {
                        // \8 and \9 are identity escapes
                        deferredCharNode->cs[0] = Chars<EncodedChar>::CTW(ECLookahead());
                        ECConsume();
                        node = deferredCharNode;
                        return false; // not an assertion
                    }
                }
                else
                {
                    ECConsume(digits);
                    node = Anew(ctAllocator, MatchGroupNode, n);
                    return false; // not an assertion
                }
            }

            // Must be between 1 and 3 octal digits
            Assert(standardEncodedChars->IsOctal(ECLookahead())); // terminating 0 is not an octal
            uint n = 0;
            CharCount digits = 0;
            do
            {
                uint m = n * 8  + standardEncodedChars->DigitValue(ECLookahead());
                if (m > Chars<uint8>::MaxUChar) // Regex octal codes only support single byte (ASCII) characters.
                    break;
                n = m;
                ECConsume();
                digits++;
            }
            while (digits < 3 && standardEncodedChars->IsOctal(ECLookahead())); // terminating 0 is not an octal

            deferredCharNode->cs[0] = UTC((UChar)n);
            node = deferredCharNode;
            return false; // not an assertion
        }
        else if (ECLookahead() == 'c')
        {
            Char c;
            if (standardEncodedChars->IsLetter(ECLookahead(1))) // terminating 0 is not a letter
            {
                c = UTC(Chars<EncodedChar>::CTU(ECLookahead(1)) % 32);
                ECConsume(2);
            }
            else
            {
                // SPEC DEVIATION: For non-letters or EOF, take the leading '\' to be itself, and
                //                 don't consume the 'c' or letter.
                c = '\\';
            }
            deferredCharNode->cs[0] = c;
            node = deferredCharNode;
            return false; // not an assertion
        }
        else
        {
            Char c = NextChar();
            switch (c)
            {
            case 'b':
                node = Anew(ctAllocator, WordBoundaryNode, false);
                return true; // Is an assertion
            case 'B':
                node = Anew(ctAllocator, WordBoundaryNode, true);
                return true; // Is an assertion
            case 'f':
                c = '\f';
                break; // fall-through for identity escape
            case 'n':
                c = '\n';
                break; // fall-through for identity escape
            case 'r':
                c = '\r';
                break; // fall-through for identity escape
            case 't':
                c = '\t';
                break; // fall-through for identity escape
            case 'v':
                c = '\v';
                break; // fall-through for identity escape
            case 'd':
                {
                    MatchSetNode *setNode = Anew(ctAllocator, MatchSetNode, false, false);
                    standardChars->SetDigits(ctAllocator, setNode->set);
                    node = setNode;
                    return false; // not an assertion
                }
            case 'D':
                {
                    node = GetNodeWithValidCharacterSet('D');
                    return false; // not an assertion
                }
            case 's':
                {
                    MatchSetNode *setNode = Anew(ctAllocator, MatchSetNode, false, false);
                    standardChars->SetWhitespace(ctAllocator, setNode->set);
                    node = setNode;
                    return false; // not an assertion
                }
            case 'S':
                {
                    node = GetNodeWithValidCharacterSet('S');
                    return false; // not an assertion
                }
            case 'w':
                {
                    MatchSetNode *setNode = Anew(ctAllocator, MatchSetNode, false, false);
                    if (this->unicodeFlagPresent && this->caseInsensitiveFlagPresent)
                    {
                        standardChars->SetWordIUChars(ctAllocator, setNode->set);
                    }
                    else
                    {
                        standardChars->SetWordChars(ctAllocator, setNode->set);
                    }
                    node = setNode;
                    return false; // not an assertion
                }
            case 'W':
                {
                    node = GetNodeWithValidCharacterSet('W');
                    return false; // not an assertion
                }
            // case 'c': handled as special case above
            case 'x':
                if (ECCanConsume(2) &&
                    standardEncodedChars->IsHex(ECLookahead(0)) &&
                    standardEncodedChars->IsHex(ECLookahead(1)))
                {
                    c = UTC((standardEncodedChars->DigitValue(ECLookahead(0)) << 4) |
                        (standardEncodedChars->DigitValue(ECLookahead(1))));
                    ECConsume(2);
                    // fall-through for identity escape
                }
                // Take to be identity escape if ill-formed as per Annex B
                break;
            case 'u':
                if (unicodeFlagPresent && TryParseExtendedUnicodeEscape(c, previousSurrogatePart) > 0)
                    break;
                else if (ECCanConsume(4) &&
                    standardEncodedChars->IsHex(ECLookahead(0)) &&
                    standardEncodedChars->IsHex(ECLookahead(1)) &&
                    standardEncodedChars->IsHex(ECLookahead(2)) &&
                    standardEncodedChars->IsHex(ECLookahead(3)))
                {
                    c = UTC((standardEncodedChars->DigitValue(ECLookahead(0)) << 12) |
                            (standardEncodedChars->DigitValue(ECLookahead(1)) << 8) |
                            (standardEncodedChars->DigitValue(ECLookahead(2)) << 4) |
                            (standardEncodedChars->DigitValue(ECLookahead(3))));
                    ECConsume(4);
                    // fall-through for identity escape
                }
                // Take to be identity escape if ill-formed as per Annex B
                break;
            case '^':
            case '$':
            case '\\':
            case '.':
            case '*':
            case '+':
            case '?':
            case '(':
            case ')':
            case '[':
            case ']':
            case '{':
            case '}':
            case '|':
            case '/':
                break; // fall-through for identity escape
            default:
                if (this->unicodeFlagPresent)
                {
                    // As per #sec-forbidden-extensions, if unicode flag is present, we must disallow any other escape.
                    this->Fail(JSERR_RegExpInvalidEscape); // throw SyntaxError
                }
                // As per Annex B, allow anything other than newlines and above. Embedded 0 is ok
                break;
            }

            // Must be an identity escape
            deferredCharNode->cs[0] = c;
            node = deferredCharNode;
            return false; // not an assertion
        }
    }